

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O0

vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *
cnn::AllocateShadowParameters(Model *m)

{
  bool bVar1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *this;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *this_00;
  Model *in_RSI;
  Parameters *in_RDI;
  Parameters **p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1;
  vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *v;
  Parameters *__args;
  __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  in_stack_ffffffffffffffc8;
  vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *in_stack_ffffffffffffffd0;
  
  __args = in_RDI;
  std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::vector
            ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)0x52bad5);
  this = Model::parameters_list(in_RSI);
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size(this);
  std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::reserve
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  this_00 = Model::parameters_list(in_RSI);
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin(this_00);
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                             *)this_00), bVar1) {
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator*((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                 *)&stack0xffffffffffffffc8);
    std::vector<cnn::ShadowParameters,std::allocator<cnn::ShadowParameters>>::
    emplace_back<cnn::Parameters&>
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)this,__args)
    ;
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return (vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)__args;
}

Assistant:

vector<ShadowParameters> AllocateShadowParameters(const Model& m) {
  vector<ShadowParameters> v;
  v.reserve(m.parameters_list().size());
  for (auto& p : m.parameters_list())
    v.emplace_back(*p);
  return v;
}